

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

Maybe<kj::Own<capnp::_::SegmentReader>_&> __thiscall
kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::find<unsigned_int&>
          (HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>> *this,uint *key)

{
  Maybe<kj::Own<capnp::_::SegmentReader>_&> MVar1;
  long lVar2;
  ArrayPtr<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry> table;
  HashIndex<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::Callbacks> local_20 [8];
  long local_18;
  
  table.size_ = *(size_t *)this;
  table.ptr = (Entry *)(this + 0x20);
  HashIndex<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::Callbacks>::
  find<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::Entry,unsigned_int&>
            (local_20,table,
             (uint *)(((long)(*(long *)(this + 8) - *(size_t *)this) >> 3) * -0x5555555555555555));
  lVar2 = 0;
  if (local_20[0] !=
      (HashIndex<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::Callbacks>)0x0) {
    lVar2 = local_18 * 0x18 + *(long *)this;
  }
  MVar1.ptr = (Own<capnp::_::SegmentReader> *)(lVar2 + 8);
  if (lVar2 == 0) {
    MVar1.ptr = (Own<capnp::_::SegmentReader> *)0x0;
  }
  return (Maybe<kj::Own<capnp::_::SegmentReader>_&>)MVar1.ptr;
}

Assistant:

kj::Maybe<Value&> HashMap<Key, Value>::find(KeyLike&& key) {
  return table.find(key).map([](Entry& e) -> Value& { return e.value; });
}